

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTryRunCommand.cxx
# Opt level: O0

void __thiscall
cmTryRunCommand::DoNotRunExecutable
          (cmTryRunCommand *this,string *runArgs,string *srcFile,string *out)

{
  cmMakefile *pcVar1;
  bool bVar2;
  string *psVar3;
  char *pcVar4;
  ostream *poVar5;
  _Ios_Openmode _Var6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  allocator<char> local_4d1;
  undefined1 local_4d0 [8];
  string errorMessage;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  allocator<char> local_429;
  undefined1 local_428 [8];
  string comment_2;
  ofstream file;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  char *local_1b8;
  char *existing;
  cmState *state_1;
  string comment_1;
  string local_180;
  allocator<char> local_159;
  string local_158;
  char *local_138;
  char *existingValue;
  cmState *state;
  string comment;
  undefined1 local_100 [7];
  bool error;
  string internalRunOutputName;
  string local_d8 [8];
  string detailsString;
  string resultFileName;
  string local_78;
  undefined1 local_48 [8];
  string copyDest;
  string *out_local;
  string *srcFile_local;
  string *runArgs_local;
  cmTryRunCommand *this_local;
  
  copyDest.field_2._8_8_ = out;
  psVar3 = cmMakefile::GetHomeOutputDirectory_abi_cxx11_
                     ((this->super_cmCoreTryCompile).super_cmCommand.Makefile);
  std::__cxx11::string::string((string *)local_48,(string *)psVar3);
  std::__cxx11::string::operator+=((string *)local_48,"/CMakeFiles");
  std::__cxx11::string::operator+=((string *)local_48,"/");
  cmsys::SystemTools::GetFilenameWithoutExtension
            (&local_78,&(this->super_cmCoreTryCompile).OutputFile);
  std::__cxx11::string::operator+=((string *)local_48,(string *)&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::operator+=((string *)local_48,"-");
  std::__cxx11::string::operator+=((string *)local_48,(string *)&this->RunResultVariable);
  cmsys::SystemTools::GetFilenameExtension
            ((string *)((long)&resultFileName.field_2 + 8),
             &(this->super_cmCoreTryCompile).OutputFile);
  std::__cxx11::string::operator+=
            ((string *)local_48,(string *)(resultFileName.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(resultFileName.field_2._M_local_buf + 8));
  cmsys::SystemTools::CopyFileAlways(&(this->super_cmCoreTryCompile).OutputFile,(string *)local_48);
  psVar3 = cmMakefile::GetHomeOutputDirectory_abi_cxx11_
                     ((this->super_cmCoreTryCompile).super_cmCommand.Makefile);
  std::__cxx11::string::string((string *)(detailsString.field_2._M_local_buf + 8),(string *)psVar3);
  std::__cxx11::string::operator+=
            ((string *)(detailsString.field_2._M_local_buf + 8),"/TryRunResults.cmake");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_d8,"For details see ",
             (allocator<char> *)(internalRunOutputName.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(internalRunOutputName.field_2._M_local_buf + 0xf));
  std::__cxx11::string::operator+=(local_d8,(string *)(detailsString.field_2._M_local_buf + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                 &this->RunResultVariable,"__TRYRUN_OUTPUT");
  comment.field_2._M_local_buf[0xf] = '\0';
  pcVar4 = cmMakefile::GetDefinition
                     ((this->super_cmCoreTryCompile).super_cmCommand.Makefile,
                      &this->RunResultVariable);
  if (pcVar4 == (char *)0x0) {
    std::__cxx11::string::string((string *)&state);
    std::__cxx11::string::operator+=
              ((string *)&state,
               "Run result of TRY_RUN(), indicates whether the executable would have been able to run on its target platform.\n"
              );
    std::__cxx11::string::operator+=((string *)&state,local_d8);
    pcVar1 = (this->super_cmCoreTryCompile).super_cmCommand.Makefile;
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddCacheDefinition
              (pcVar1,&this->RunResultVariable,"PLEASE_FILL_OUT-FAILED_TO_RUN",pcVar4,STRING,false);
    existingValue =
         (char *)cmMakefile::GetState((this->super_cmCoreTryCompile).super_cmCommand.Makefile);
    local_138 = cmState::GetCacheEntryValue((cmState *)existingValue,&this->RunResultVariable);
    pcVar4 = existingValue;
    if (local_138 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"ADVANCED",&local_159)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_180,"1",(allocator<char> *)(comment_1.field_2._M_local_buf + 0xf))
      ;
      cmState::SetCacheEntryProperty
                ((cmState *)pcVar4,&this->RunResultVariable,&local_158,&local_180);
      std::__cxx11::string::~string((string *)&local_180);
      std::allocator<char>::~allocator((allocator<char> *)(comment_1.field_2._M_local_buf + 0xf));
      std::__cxx11::string::~string((string *)&local_158);
      std::allocator<char>::~allocator(&local_159);
    }
    comment.field_2._M_local_buf[0xf] = '\x01';
    std::__cxx11::string::~string((string *)&state);
  }
  if ((copyDest.field_2._8_8_ != 0) &&
     (pcVar4 = cmMakefile::GetDefinition
                         ((this->super_cmCoreTryCompile).super_cmCommand.Makefile,
                          (string *)local_100), pcVar4 == (char *)0x0)) {
    std::__cxx11::string::string((string *)&state_1);
    std::__cxx11::string::operator+=
              ((string *)&state_1,
               "Output of TRY_RUN(), contains the text, which the executable would have printed on stdout and stderr on its target platform.\n"
              );
    std::__cxx11::string::operator+=((string *)&state_1,local_d8);
    pcVar1 = (this->super_cmCoreTryCompile).super_cmCommand.Makefile;
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddCacheDefinition
              (pcVar1,(string *)local_100,"PLEASE_FILL_OUT-NOTFOUND",pcVar4,STRING,false);
    existing = (char *)cmMakefile::GetState((this->super_cmCoreTryCompile).super_cmCommand.Makefile)
    ;
    local_1b8 = cmState::GetCacheEntryValue((cmState *)existing,(string *)local_100);
    pcVar4 = existing;
    if (local_1b8 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"ADVANCED",&local_1d9)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_200,"1",(allocator<char> *)&file.field_0x1ff);
      cmState::SetCacheEntryProperty((cmState *)pcVar4,(string *)local_100,&local_1d8,&local_200);
      std::__cxx11::string::~string((string *)&local_200);
      std::allocator<char>::~allocator((allocator<char> *)&file.field_0x1ff);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::allocator<char>::~allocator(&local_1d9);
    }
    comment.field_2._M_local_buf[0xf] = '\x01';
    std::__cxx11::string::~string((string *)&state_1);
  }
  if ((comment.field_2._M_local_buf[0xf] & 1U) == 0) {
    if (copyDest.field_2._8_8_ != 0) {
      pcVar4 = cmMakefile::GetDefinition
                         ((this->super_cmCoreTryCompile).super_cmCommand.Makefile,
                          (string *)local_100);
      std::__cxx11::string::operator=((string *)copyDest.field_2._8_8_,pcVar4);
    }
  }
  else {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    _Var6 = _S_app;
    if ((DoNotRunExecutable::firstTryRun & 1U) != 0) {
      _Var6 = _S_out;
    }
    std::ofstream::ofstream((void *)((long)&comment_2.field_2 + 8),pcVar4,_Var6);
    bVar2 = std::ios::operator_cast_to_bool
                      ((ios *)((long)&comment_2.field_2 +
                              *(long *)(comment_2.field_2._8_8_ + -0x18) + 8));
    if (bVar2) {
      if ((DoNotRunExecutable::firstTryRun & 1U) != 0) {
        std::operator<<((ostream *)((long)&comment_2.field_2 + 8),
                        "# This file was generated by CMake because it detected TRY_RUN() commands\n# in crosscompiling mode. It will be overwritten by the next CMake run.\n# Copy it to a safe location, set the variables to appropriate values\n# and use it then to preset the CMake cache (using -C).\n\n"
                       );
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_428,"\n",&local_429);
      std::allocator<char>::~allocator(&local_429);
      std::__cxx11::string::operator+=((string *)local_428,(string *)&this->RunResultVariable);
      std::__cxx11::string::operator+=
                ((string *)local_428,
                 "\n   indicates whether the executable would have been able to run on its\n   target platform. If so, set "
                );
      std::__cxx11::string::operator+=((string *)local_428,(string *)&this->RunResultVariable);
      std::__cxx11::string::operator+=
                ((string *)local_428,
                 " to\n   the exit code (in many cases 0 for success), otherwise enter \"FAILED_TO_RUN\".\n"
                );
      if (copyDest.field_2._8_8_ != 0) {
        std::__cxx11::string::operator+=((string *)local_428,(string *)local_100);
        std::__cxx11::string::operator+=
                  ((string *)local_428,
                   "\n   contains the text the executable would have printed on stdout and stderr.\n   If the executable would not have been able to run, set "
                  );
        std::__cxx11::string::operator+=((string *)local_428,(string *)local_100);
        std::__cxx11::string::operator+=
                  ((string *)local_428,
                   " empty.\n   Otherwise check if the output is evaluated by the calling CMake code. If so,\n   check what the source file would have printed when called with the given arguments.\n"
                  );
      }
      std::__cxx11::string::operator+=((string *)local_428,"The ");
      std::__cxx11::string::operator+=((string *)local_428,(string *)&this->CompileResultVariable);
      std::__cxx11::string::operator+=
                ((string *)local_428,
                 " variable holds the build result for this TRY_RUN().\n\nSource file   : ");
      std::operator+(&local_450,srcFile,"\n");
      std::__cxx11::string::operator+=((string *)local_428,(string *)&local_450);
      std::__cxx11::string::~string((string *)&local_450);
      std::__cxx11::string::operator+=((string *)local_428,"Executable    : ");
      std::operator+(&local_470,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                     "\n");
      std::__cxx11::string::operator+=((string *)local_428,(string *)&local_470);
      std::__cxx11::string::~string((string *)&local_470);
      std::__cxx11::string::operator+=((string *)local_428,"Run arguments : ");
      std::__cxx11::string::operator+=((string *)local_428,(string *)runArgs);
      std::__cxx11::string::operator+=((string *)local_428,"\n");
      cmMakefile::FormatListFileStack_abi_cxx11_
                ((string *)((long)&errorMessage.field_2 + 8),
                 (this->super_cmCoreTryCompile).super_cmCommand.Makefile);
      std::operator+(&local_490,"   Called from: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&errorMessage.field_2 + 8));
      std::__cxx11::string::operator+=((string *)local_428,(string *)&local_490);
      std::__cxx11::string::~string((string *)&local_490);
      std::__cxx11::string::~string((string *)(errorMessage.field_2._M_local_buf + 8));
      cmsys::SystemTools::ReplaceString((string *)local_428,"\n","\n# ");
      poVar5 = std::operator<<((ostream *)((long)&comment_2.field_2 + 8),(string *)local_428);
      std::operator<<(poVar5,"\n\n");
      poVar5 = std::operator<<((ostream *)((long)&comment_2.field_2 + 8),"set( ");
      poVar5 = std::operator<<(poVar5,(string *)&this->RunResultVariable);
      poVar5 = std::operator<<(poVar5," \n     \"");
      pcVar4 = cmMakefile::GetDefinition
                         ((this->super_cmCoreTryCompile).super_cmCommand.Makefile,
                          &this->RunResultVariable);
      poVar5 = std::operator<<(poVar5,pcVar4);
      std::operator<<(poVar5,"\"\n     CACHE STRING \"Result from TRY_RUN\" FORCE)\n\n");
      if (copyDest.field_2._8_8_ != 0) {
        poVar5 = std::operator<<((ostream *)((long)&comment_2.field_2 + 8),"set( ");
        poVar5 = std::operator<<(poVar5,(string *)local_100);
        poVar5 = std::operator<<(poVar5," \n     \"");
        pcVar4 = cmMakefile::GetDefinition
                           ((this->super_cmCoreTryCompile).super_cmCommand.Makefile,
                            (string *)local_100);
        poVar5 = std::operator<<(poVar5,pcVar4);
        std::operator<<(poVar5,"\"\n     CACHE STRING \"Output from TRY_RUN\" FORCE)\n\n");
      }
      std::ofstream::close();
      std::__cxx11::string::~string((string *)local_428);
    }
    DoNotRunExecutable::firstTryRun = false;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_4d0,
               "TRY_RUN() invoked in cross-compiling mode, please set the following cache variables appropriately:\n"
               ,&local_4d1);
    std::allocator<char>::~allocator(&local_4d1);
    std::operator+(&local_518,"   ",&this->RunResultVariable);
    std::operator+(&local_4f8,&local_518," (advanced)\n");
    std::__cxx11::string::operator+=((string *)local_4d0,(string *)&local_4f8);
    std::__cxx11::string::~string((string *)&local_4f8);
    std::__cxx11::string::~string((string *)&local_518);
    if (copyDest.field_2._8_8_ != 0) {
      std::operator+(&local_558,"   ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100)
      ;
      std::operator+(&local_538,&local_558," (advanced)\n");
      std::__cxx11::string::operator+=((string *)local_4d0,(string *)&local_538);
      std::__cxx11::string::~string((string *)&local_538);
      std::__cxx11::string::~string((string *)&local_558);
    }
    std::__cxx11::string::operator+=((string *)local_4d0,local_d8);
    cmSystemTools::Error((string *)local_4d0);
    std::__cxx11::string::~string((string *)local_4d0);
    std::ofstream::~ofstream((void *)((long)&comment_2.field_2 + 8));
  }
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string((string *)(detailsString.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void cmTryRunCommand::DoNotRunExecutable(const std::string& runArgs,
                                         const std::string& srcFile,
                                         std::string* out)
{
  // copy the executable out of the CMakeFiles/ directory, so it is not
  // removed at the end of TRY_RUN and the user can run it manually
  // on the target platform.
  std::string copyDest = this->Makefile->GetHomeOutputDirectory();
  copyDest += "/CMakeFiles";
  copyDest += "/";
  copyDest += cmSystemTools::GetFilenameWithoutExtension(this->OutputFile);
  copyDest += "-";
  copyDest += this->RunResultVariable;
  copyDest += cmSystemTools::GetFilenameExtension(this->OutputFile);
  cmSystemTools::CopyFileAlways(this->OutputFile, copyDest);

  std::string resultFileName = this->Makefile->GetHomeOutputDirectory();
  resultFileName += "/TryRunResults.cmake";

  std::string detailsString = "For details see ";
  detailsString += resultFileName;

  std::string internalRunOutputName =
    this->RunResultVariable + "__TRYRUN_OUTPUT";
  bool error = false;

  if (this->Makefile->GetDefinition(this->RunResultVariable) == nullptr) {
    // if the variables doesn't exist, create it with a helpful error text
    // and mark it as advanced
    std::string comment;
    comment += "Run result of TRY_RUN(), indicates whether the executable "
               "would have been able to run on its target platform.\n";
    comment += detailsString;
    this->Makefile->AddCacheDefinition(this->RunResultVariable,
                                       "PLEASE_FILL_OUT-FAILED_TO_RUN",
                                       comment.c_str(), cmStateEnums::STRING);

    cmState* state = this->Makefile->GetState();
    const char* existingValue =
      state->GetCacheEntryValue(this->RunResultVariable);
    if (existingValue) {
      state->SetCacheEntryProperty(this->RunResultVariable, "ADVANCED", "1");
    }

    error = true;
  }

  // is the output from the executable used ?
  if (out != nullptr) {
    if (this->Makefile->GetDefinition(internalRunOutputName) == nullptr) {
      // if the variables doesn't exist, create it with a helpful error text
      // and mark it as advanced
      std::string comment;
      comment +=
        "Output of TRY_RUN(), contains the text, which the executable "
        "would have printed on stdout and stderr on its target platform.\n";
      comment += detailsString;

      this->Makefile->AddCacheDefinition(
        internalRunOutputName, "PLEASE_FILL_OUT-NOTFOUND", comment.c_str(),
        cmStateEnums::STRING);
      cmState* state = this->Makefile->GetState();
      const char* existing = state->GetCacheEntryValue(internalRunOutputName);
      if (existing) {
        state->SetCacheEntryProperty(internalRunOutputName, "ADVANCED", "1");
      }

      error = true;
    }
  }

  if (error) {
    static bool firstTryRun = true;
    cmsys::ofstream file(resultFileName.c_str(),
                         firstTryRun ? std::ios::out : std::ios::app);
    if (file) {
      if (firstTryRun) {
        /* clang-format off */
        file << "# This file was generated by CMake because it detected "
                "TRY_RUN() commands\n"
                "# in crosscompiling mode. It will be overwritten by the next "
                "CMake run.\n"
                "# Copy it to a safe location, set the variables to "
                "appropriate values\n"
                "# and use it then to preset the CMake cache (using -C).\n\n";
        /* clang-format on */
      }

      std::string comment = "\n";
      comment += this->RunResultVariable;
      comment += "\n   indicates whether the executable would have been able "
                 "to run on its\n"
                 "   target platform. If so, set ";
      comment += this->RunResultVariable;
      comment += " to\n"
                 "   the exit code (in many cases 0 for success), otherwise "
                 "enter \"FAILED_TO_RUN\".\n";
      if (out != nullptr) {
        comment += internalRunOutputName;
        comment +=
          "\n   contains the text the executable "
          "would have printed on stdout and stderr.\n"
          "   If the executable would not have been able to run, set ";
        comment += internalRunOutputName;
        comment += " empty.\n"
                   "   Otherwise check if the output is evaluated by the "
                   "calling CMake code. If so,\n"
                   "   check what the source file would have printed when "
                   "called with the given arguments.\n";
      }
      comment += "The ";
      comment += this->CompileResultVariable;
      comment += " variable holds the build result for this TRY_RUN().\n\n"
                 "Source file   : ";
      comment += srcFile + "\n";
      comment += "Executable    : ";
      comment += copyDest + "\n";
      comment += "Run arguments : ";
      comment += runArgs;
      comment += "\n";
      comment += "   Called from: " + this->Makefile->FormatListFileStack();
      cmsys::SystemTools::ReplaceString(comment, "\n", "\n# ");
      file << comment << "\n\n";

      file << "set( " << this->RunResultVariable << " \n     \""
           << this->Makefile->GetDefinition(this->RunResultVariable)
           << "\"\n     CACHE STRING \"Result from TRY_RUN\" FORCE)\n\n";

      if (out != nullptr) {
        file << "set( " << internalRunOutputName << " \n     \""
             << this->Makefile->GetDefinition(internalRunOutputName)
             << "\"\n     CACHE STRING \"Output from TRY_RUN\" FORCE)\n\n";
      }
      file.close();
    }
    firstTryRun = false;

    std::string errorMessage = "TRY_RUN() invoked in cross-compiling mode, "
                               "please set the following cache variables "
                               "appropriately:\n";
    errorMessage += "   " + this->RunResultVariable + " (advanced)\n";
    if (out != nullptr) {
      errorMessage += "   " + internalRunOutputName + " (advanced)\n";
    }
    errorMessage += detailsString;
    cmSystemTools::Error(errorMessage);
    return;
  }

  if (out != nullptr) {
    (*out) = this->Makefile->GetDefinition(internalRunOutputName);
  }
}